

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout_p.h
# Opt level: O0

uint qConvertRgb64ToRgb30<(QtPixelOrder)1>(QRgba64 c)

{
  QRgba64 p;
  quint16 qVar1;
  quint16 qVar2;
  quint16 qVar3;
  uint uVar4;
  long in_FS_OFFSET;
  uint b;
  uint g;
  uint r;
  uint a;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  QRgba64 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  p.rgba._4_4_ = in_stack_ffffffffffffffd4;
  p.rgba._0_4_ = in_stack_ffffffffffffffd0;
  local_10 = qRepremultiply<14u>(p);
  qVar1 = QRgba64::alpha(&local_10);
  qVar2 = QRgba64::red(&local_10);
  qVar3 = QRgba64::green(&local_10);
  uVar4 = (uint)(qVar3 >> 6);
  qVar3 = QRgba64::blue(&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (uint)(qVar1 >> 0xe) << 0x1e | (uint)(qVar3 >> 6) << 0x14 | uVar4 << 10 |
           (uint)(qVar2 >> 6);
  }
  __stack_chk_fail();
}

Assistant:

inline unsigned int qConvertRgb64ToRgb30<PixelOrderBGR>(QRgba64 c)
{
    c = qRepremultiply<14>(c);
    const uint a = c.alpha() >> 14;
    const uint r = c.red()   >> 6;
    const uint g = c.green() >> 6;
    const uint b = c.blue()  >> 6;
    return (a << 30) | (b << 20) | (g << 10) | r;
}